

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssvectorbase.h
# Opt level: O2

SSVectorBase<double> * __thiscall
soplex::SSVectorBase<double>::operator=(SSVectorBase<double> *this,SSVectorBase<double> *rhs)

{
  double dVar1;
  int iVar2;
  int *piVar3;
  pointer pdVar4;
  pointer pdVar5;
  ulong uVar6;
  int i;
  long lVar7;
  double dVar8;
  
  if (this != rhs) {
    clear(this);
    std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->_tolerances).
                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>,
               &(rhs->_tolerances).
                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
    setMax(this,(rhs->super_IdxSet).len);
    VectorBase<double>::reDim
              (&this->super_VectorBase<double>,
               (int)((ulong)((long)(rhs->super_VectorBase<double>).val.
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_finish -
                            (long)(rhs->super_VectorBase<double>).val.
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_start) >> 3),true);
    if (rhs->setupStatus == true) {
      IdxSet::operator=(&this->super_IdxSet,&rhs->super_IdxSet);
      piVar3 = (this->super_IdxSet).idx;
      pdVar4 = (rhs->super_VectorBase<double>).val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      pdVar5 = (this->super_VectorBase<double>).val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      for (uVar6 = (ulong)(uint)(this->super_IdxSet).num; 0 < (int)uVar6; uVar6 = uVar6 - 1) {
        iVar2 = piVar3[uVar6 - 1];
        pdVar5[iVar2] = pdVar4[iVar2];
      }
    }
    else {
      (this->super_IdxSet).num = 0;
      for (lVar7 = 0;
          pdVar4 = (rhs->super_VectorBase<double>).val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start,
          lVar7 < (int)((ulong)((long)(rhs->super_VectorBase<double>).val.
                                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                      super__Vector_impl_data._M_finish - (long)pdVar4) >> 3);
          lVar7 = lVar7 + 1) {
        dVar1 = pdVar4[lVar7];
        dVar8 = getEpsilon(this);
        if (dVar8 < ABS(dVar1)) {
          (this->super_VectorBase<double>).val.super__Vector_base<double,_std::allocator<double>_>.
          _M_impl.super__Vector_impl_data._M_start[lVar7] =
               (rhs->super_VectorBase<double>).val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[lVar7];
          (this->super_IdxSet).idx[(this->super_IdxSet).num] = (int)lVar7;
          piVar3 = &(this->super_IdxSet).num;
          *piVar3 = *piVar3 + 1;
        }
      }
    }
    this->setupStatus = true;
  }
  return this;
}

Assistant:

SSVectorBase<R>& operator=(const SSVectorBase<R>& rhs)
   {
      assert(rhs.isConsistent());

      if(this != &rhs)
      {
         clear();
         _tolerances = rhs._tolerances;
         setMax(rhs.max());
         VectorBase<R>::reDim(rhs.dim());

         if(rhs.isSetup())
         {
            IdxSet::operator=(rhs);

            for(int i = size() - 1; i >= 0; --i)
            {
               int j = index(i);
               VectorBase<R>::val[j] = rhs.val[j];
            }
         }
         else
         {
            num = 0;

            for(int i = 0; i < rhs.dim(); ++i)
            {
               if(spxAbs(rhs.val[i]) > this->getEpsilon())
               {
                  VectorBase<R>::val[i] = rhs.val[i];
                  idx[num] = i;
                  num++;
               }
            }
         }

         setupStatus = true;
      }

      assert(isConsistent());

      return *this;
   }